

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O2

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_38;
  float local_34;
  float local_30;
  
  renderPixel((embree *)&local_38,data,(float)x,(float)y,camera,stats);
  if (1.0 <= local_38) {
    local_38 = 1.0;
  }
  fVar2 = 0.0;
  if (0.0 <= local_38) {
    fVar2 = local_38;
  }
  if (1.0 <= local_34) {
    local_34 = 1.0;
  }
  fVar3 = 0.0;
  if (0.0 <= local_34) {
    fVar3 = local_34;
  }
  if (1.0 <= local_30) {
    local_30 = 1.0;
  }
  fVar1 = 0.0;
  if (0.0 <= local_30) {
    fVar1 = local_30;
  }
  pixels[width * y + x] =
       (int)(long)(fVar3 * 255.0) * 0x100 + (int)(long)(fVar2 * 255.0) +
       (int)(long)(fVar1 * 255.0) * 0x10000;
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* calculate pixel color */
  Vec3fa color = renderPixel(data, (float)x,(float)y,camera, stats);
  
  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}